

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocketnotifier.cpp
# Opt level: O2

void __thiscall QSocketNotifier::QSocketNotifier(QSocketNotifier *this,Type type,QObject *parent)

{
  QObjectData *pQVar1;
  QSocketNotifierPrivate *this_00;
  
  this_00 = (QSocketNotifierPrivate *)operator_new(0x88);
  QSocketNotifierPrivate::QSocketNotifierPrivate(this_00);
  QObject::QObject(&this->super_QObject,(QObjectPrivate *)this_00,parent);
  (this->super_QObject)._vptr_QObject = (_func_int **)&PTR_metaObject_00666138;
  pQVar1 = (this->super_QObject).d_ptr.d;
  qMetaTypeId<QSocketDescriptor>();
  qMetaTypeId<QSocketNotifier::Type>();
  *(Type *)((long)&pQVar1[1].children.d.size + 4) = type;
  return;
}

Assistant:

QSocketNotifier::QSocketNotifier(Type type, QObject *parent)
    : QObject(*new QSocketNotifierPrivate, parent)
{
    Q_D(QSocketNotifier);

    qRegisterMetaType<QSocketDescriptor>();
    qRegisterMetaType<QSocketNotifier::Type>();

    d->sntype = type;
}